

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint unfilter(uchar *out,uchar *in,uint w,uint h,uint bpp)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  byte bVar13;
  uchar *puVar14;
  uint uVar15;
  uint uVar17;
  uchar *puVar19;
  uchar *puVar20;
  long lVar21;
  uchar *puVar22;
  uchar *puVar23;
  ulong uVar16;
  ulong uVar18;
  
  if (h != 0) {
    uVar5 = bpp + 7;
    uVar15 = uVar5 >> 3;
    uVar16 = (ulong)uVar15;
    uVar10 = w * bpp + 7;
    uVar17 = uVar10 >> 3;
    uVar18 = (ulong)uVar17;
    lVar1 = uVar18 + 1;
    puVar19 = in + 1;
    lVar12 = uVar18 - uVar16;
    puVar22 = out + uVar16;
    puVar23 = in + uVar16 + 1;
    uVar9 = 0;
    puVar20 = (uchar *)0x0;
    puVar14 = out;
    do {
      switch(in[lVar1 * uVar9]) {
      case '\0':
        if (7 < uVar10) {
          uVar6 = 0;
          do {
            puVar14[uVar6] = puVar19[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar18 != uVar6);
        }
        break;
      case '\x01':
        if (7 < uVar5) {
          uVar6 = 0;
          do {
            puVar14[uVar6] = puVar19[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar16 != uVar6);
        }
        if (uVar15 < uVar17) {
          lVar21 = 0;
          do {
            puVar22[lVar21] = puVar14[lVar21] + puVar23[lVar21];
            lVar21 = lVar21 + 1;
          } while (lVar12 != lVar21);
        }
        break;
      case '\x02':
        if (puVar20 == (uchar *)0x0) {
          if (7 < uVar10) {
            uVar6 = 0;
            do {
              puVar14[uVar6] = puVar19[uVar6];
              uVar6 = uVar6 + 1;
            } while (uVar18 != uVar6);
          }
        }
        else if (7 < uVar10) {
          uVar6 = 0;
          do {
            puVar14[uVar6] = puVar20[uVar6] + puVar19[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar18 != uVar6);
        }
        break;
      case '\x03':
        if (puVar20 == (uchar *)0x0) {
          if (7 < uVar5) {
            uVar6 = 0;
            do {
              puVar14[uVar6] = puVar19[uVar6];
              uVar6 = uVar6 + 1;
            } while (uVar16 != uVar6);
          }
          if (uVar15 < uVar17) {
            lVar21 = 0;
            do {
              puVar22[lVar21] = (puVar14[lVar21] >> 1) + puVar23[lVar21];
              lVar21 = lVar21 + 1;
            } while (lVar12 != lVar21);
          }
        }
        else {
          if (7 < uVar5) {
            uVar6 = 0;
            do {
              puVar14[uVar6] = (puVar20[uVar6] >> 1) + puVar19[uVar6];
              uVar6 = uVar6 + 1;
            } while (uVar16 != uVar6);
          }
          if (uVar15 < uVar17) {
            lVar21 = 0;
            do {
              puVar22[lVar21] =
                   (char)((uint)puVar20[lVar21 + uVar16] + (uint)puVar14[lVar21] >> 1) +
                   puVar23[lVar21];
              lVar21 = lVar21 + 1;
            } while (lVar12 != lVar21);
          }
        }
        break;
      case '\x04':
        if (puVar20 == (uchar *)0x0) {
          if (7 < uVar5) {
            uVar6 = 0;
            do {
              puVar14[uVar6] = puVar19[uVar6];
              uVar6 = uVar6 + 1;
            } while (uVar16 != uVar6);
          }
          if (uVar15 < uVar17) {
            lVar21 = 0;
            do {
              puVar22[lVar21] = puVar14[lVar21] + puVar23[lVar21];
              lVar21 = lVar21 + 1;
            } while (lVar12 != lVar21);
          }
        }
        else {
          if (7 < uVar5) {
            uVar6 = 0;
            do {
              puVar14[uVar6] = puVar20[uVar6] + puVar19[uVar6];
              uVar6 = uVar6 + 1;
            } while (uVar16 != uVar6);
          }
          if (uVar15 < uVar17) {
            lVar21 = 0;
            do {
              bVar2 = puVar14[lVar21];
              bVar13 = puVar20[lVar21 + uVar16];
              bVar4 = puVar20[lVar21];
              uVar7 = (uint)bVar13 - (uint)bVar4;
              uVar3 = -uVar7;
              if (0 < (int)uVar7) {
                uVar3 = uVar7;
              }
              uVar8 = (uint)bVar2 - (uint)bVar4;
              uVar7 = -uVar8;
              if (0 < (int)uVar8) {
                uVar7 = uVar8;
              }
              uVar11 = (uint)bVar2 + (uint)bVar13 + (uint)bVar4 * -2;
              uVar8 = -uVar11;
              if (0 < (int)uVar11) {
                uVar8 = uVar11;
              }
              if ((uVar3 & 0xff) <= (uVar7 & 0xff)) {
                bVar13 = bVar2;
              }
              if ((uVar7 & 0xff) <= uVar8) {
                bVar4 = bVar13;
              }
              if ((uVar3 & 0xff) <= uVar8) {
                bVar4 = bVar13;
              }
              puVar22[lVar21] = bVar4 + puVar23[lVar21];
              lVar21 = lVar21 + 1;
            } while (lVar12 != lVar21);
          }
        }
        break;
      default:
        return 0x24;
      }
      puVar20 = out + uVar9 * uVar18;
      uVar9 = uVar9 + 1;
      puVar14 = puVar14 + uVar18;
      puVar19 = puVar19 + lVar1;
      puVar22 = puVar22 + uVar18;
      puVar23 = puVar23 + lVar1;
    } while (uVar9 != h);
    return 0;
  }
  return 0;
}

Assistant:

static unsigned unfilter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h, unsigned bpp)
{
	/*
	For PNG filter method 0
	this function unfilters a single image (e.g. without interlacing this is called once, with Adam7 seven times)
	out must have enough bytes allocated already, in must have the scanlines + 1 filtertype byte per scanline
	w and h are image dimensions or dimensions of reduced image, bpp is bits per pixel
	in and out are allowed to be the same memory address (but aren't the same size since in has the extra filter bytes)
	*/

	unsigned y;
	unsigned char* prevline = 0;

	/*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
	size_t bytewidth = (bpp + 7) / 8;
	size_t linebytes = (w * bpp + 7) / 8;

	for (y = 0; y < h; ++y)
	{
		size_t outindex = linebytes * y;
		size_t inindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
		unsigned char filterType = in[inindex];

		CERROR_TRY_RETURN(unfilterScanline(&out[outindex], &in[inindex + 1], prevline, bytewidth, filterType, linebytes));

		prevline = &out[outindex];
	}

	return 0;
}